

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

db_bit * __thiscall lan::db::get_array_bit(db *this,db_bits *array,size_t index)

{
  ulong local_38;
  register_t i;
  db_bit *buffer;
  size_t index_local;
  db_bits *array_local;
  db *this_local;
  
  i = (register_t)array;
  if ((array->type == Array) && (i = (register_t)array->lin, (db_bit *)i != (db_bit *)0x0)) {
    for (local_38 = 0; local_38 < index; local_38 = local_38 + 1) {
      if (i == 0) {
        return (db_bit *)0x0;
      }
      i = *(register_t *)(i + 0x38);
    }
  }
  return (db_bit *)i;
}

Assistant:

lan::db_bit * db::get_array_bit(lan::db_bits * array, size_t index){
            lan::db_bit * buffer = array;
            if(array->type == lan::Array and (buffer = buffer->lin)){
                for(register_t i = 0 ; i < index ; i++, buffer = buffer->nex){
                    if(!buffer)
                        return nullptr;
                }
            } return buffer;
        }